

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

void __thiscall lf::geometry::TriaO2::TriaO2(TriaO2 *this,Matrix<double,__1,_6,_0,__1,_6> *coords)

{
  Matrix<double,__1,_6,_0,__1,_6> *pMVar1;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  Matrix<double,__1,_2,_0,__1,_2> *this_01;
  PointerType pdVar2;
  Index IVar3;
  double dVar4;
  undefined8 uVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  scalar_product_op<double,_double> local_3f9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3c8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3b8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3a8;
  Matrix<double,__1,_1,_0,__1,_1> *local_398;
  Matrix<double,__1,_2,_0,__1,_2> *local_390;
  scalar_constant_op<double> local_388;
  undefined1 local_380 [24];
  scalar_constant_op<double> local_368;
  scalar_constant_op<double> local_360;
  scalar_constant_op<double> sStack_358;
  RhsNested local_350;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_2f8;
  Matrix<double,__1,_1,_0,__1,_1> *local_2e0;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_2d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_2b8;
  undefined1 local_288 [136];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_200;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1a0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_170;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_100;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_004a1d68;
  pMVar1 = &this->coords_;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.m_data =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>).m_storage.m_data;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.m_rows =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>).m_storage.m_rows;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>).m_storage.m_data =
       (double *)0x0;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>).m_storage.m_rows = 0;
  this_00 = &this->alpha_;
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,IVar3);
  local_390 = &this->beta_;
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data =
       (double *)0x0;
  (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows = 0;
  local_2e0 = this_00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&local_390->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar3,2);
  this_01 = &this->gamma_;
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data =
       (double *)0x0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows = 0
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar3,2);
  local_398 = &this->delta_;
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  (this->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_398->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,IVar3);
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  (this->gamma_x_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data
       = (double *)0x0;
  (this->gamma_x_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows
       = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&(this->gamma_x_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,
             IVar3,2);
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_rows,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 0.0;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3f8.m_storage.m_data = (double *)0x0;
  local_3f8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3f8,local_380._8_8_,1);
  uVar5 = local_380._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3f8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3f8.m_storage.m_rows - (local_3f8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3f8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      pdVar2 = (PointerType)(uVar5 + lVar7 * 8);
      dVar4 = pdVar2[1];
      local_3f8.m_storage.m_data[lVar7] = *pdVar2;
      (local_3f8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3f8.m_storage.m_rows) {
    do {
      local_3f8.m_storage.m_data[uVar6] = *(PointerType)(uVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3f8.m_storage.m_rows != uVar6);
  }
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data + IVar3,IVar3,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 4.94065645841247e-324;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3b8.m_storage.m_data = (double *)0x0;
  local_3b8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3b8,local_380._8_8_,1);
  uVar5 = local_380._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3b8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3b8.m_storage.m_rows - (local_3b8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3b8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      pdVar2 = (PointerType)(uVar5 + lVar7 * 8);
      dVar4 = pdVar2[1];
      local_3b8.m_storage.m_data[lVar7] = *pdVar2;
      (local_3b8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3b8.m_storage.m_rows) {
    do {
      local_3b8.m_storage.m_data[uVar6] = *(PointerType)(uVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3b8.m_storage.m_rows != uVar6);
  }
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data + IVar3 * 2,IVar3,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 9.88131291682493e-324;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3c8.m_storage.m_data = (double *)0x0;
  local_3c8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3c8,local_380._8_8_,1);
  uVar5 = local_380._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3c8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3c8.m_storage.m_rows - (local_3c8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3c8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      pdVar2 = (PointerType)(uVar5 + lVar7 * 8);
      dVar4 = pdVar2[1];
      local_3c8.m_storage.m_data[lVar7] = *pdVar2;
      (local_3c8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3c8.m_storage.m_rows) {
    do {
      local_3c8.m_storage.m_data[uVar6] = *(PointerType)(uVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3c8.m_storage.m_rows != uVar6);
  }
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data + IVar3 * 3,IVar3,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 1.48219693752374e-323;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3d8.m_storage.m_data = (double *)0x0;
  local_3d8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3d8,local_380._8_8_,1);
  uVar5 = local_380._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3d8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3d8.m_storage.m_rows - (local_3d8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3d8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      pdVar2 = (PointerType)(uVar5 + lVar7 * 8);
      dVar4 = pdVar2[1];
      local_3d8.m_storage.m_data[lVar7] = *pdVar2;
      (local_3d8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3d8.m_storage.m_rows) {
    do {
      local_3d8.m_storage.m_data[uVar6] = *(PointerType)(uVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3d8.m_storage.m_rows != uVar6);
  }
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data + IVar3 * 4,IVar3,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 1.97626258336499e-323;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3a8.m_storage.m_data = (double *)0x0;
  local_3a8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3a8,local_380._8_8_,1);
  uVar5 = local_380._0_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3a8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3a8.m_storage.m_rows - (local_3a8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3a8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      pdVar2 = (PointerType)(uVar5 + lVar7 * 8);
      dVar4 = pdVar2[1];
      local_3a8.m_storage.m_data[lVar7] = *pdVar2;
      (local_3a8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3a8.m_storage.m_rows) {
    do {
      local_3a8.m_storage.m_data[uVar6] = *(PointerType)(uVar5 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3a8.m_storage.m_rows != uVar6);
  }
  IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_6,_0,_-1,_6>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true>,_0> *)
             local_380,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
             m_storage.m_data + IVar3 * 5,IVar3,1);
  local_360.m_other = 0.0;
  sStack_358.m_other = 2.47032822920623e-323;
  local_350 = (RhsNested)
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.
              m_storage.m_rows;
  local_3e8.m_storage.m_data = (double *)0x0;
  local_3e8.m_storage.m_rows = 0;
  local_368.m_other = (double)pMVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3e8,local_380._8_8_,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,6,0,_1,6>,_1,1,true>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3e8,
             (Block<Eigen::Matrix<double,__1,_6,_0,__1,_6>,__1,_1,_true> *)local_380,
             (assign_op<double,_double> *)local_288);
  uVar6 = local_3e8.m_storage.m_rows - (local_3e8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_3e8.m_storage.m_rows) {
    lVar7 = 0;
    do {
      dVar4 = ((PointerType)(local_380._0_8_ + lVar7 * 8))[1];
      local_3e8.m_storage.m_data[lVar7] = *(PointerType)(local_380._0_8_ + lVar7 * 8);
      (local_3e8.m_storage.m_data + lVar7)[1] = dVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < local_3e8.m_storage.m_rows) {
    do {
      local_3e8.m_storage.m_data[uVar6] = *(PointerType)(local_380._0_8_ + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (local_3e8.m_storage.m_rows != uVar6);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
  CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_50,this_00,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_3f8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_50);
  local_170._0_8_ = 0x4010000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_288,local_3d8.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_1a0,(Lhs *)local_288,(Rhs *)&local_3d8,
                  (scalar_product_op<double,_double> *)&local_2b8);
  local_170._0_8_ = 0x4008000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_288,local_3f8.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_2b8,(Lhs *)local_288,(Rhs *)&local_3f8,
                  (scalar_product_op<double,_double> *)&local_1d0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp(&local_c0,&local_1a0,&local_2b8,(scalar_difference_op<double,_double> *)local_288)
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_380,&local_c0,(Rhs *)&local_3b8,
                  (scalar_difference_op<double,_double> *)local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_2d8,local_390,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_380);
  local_2f8.m_lhs = (LhsNested)0x4010000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_200,local_3e8.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)&local_2f8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_1d0,(Lhs *)&local_200,(Rhs *)&local_3e8,
                  (scalar_product_op<double,_double> *)&local_388);
  local_388.m_other = 3.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_2f8,local_3f8.m_storage.m_rows,1,&local_388);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_200,(Lhs *)&local_2f8,(Rhs *)&local_3f8,&local_3f9);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp(&local_170,&local_1d0,&local_200,
                  (scalar_difference_op<double,_double> *)&local_2f8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_288,&local_170,(Rhs *)&local_3c8,
                  (scalar_difference_op<double,_double> *)&local_2f8);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_2d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_2d8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_2d8,(Lhs *)&local_3f8,(Rhs *)&local_3b8,
                  (scalar_sum_op<double,_double> *)local_288);
  local_170._0_8_ = 0x4000000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_288,*(Index *)(local_2d8.m_row + 8),1,
                   (scalar_constant_op<double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_c0,(Lhs *)local_288,(Rhs *)&local_2d8,
                  (scalar_product_op<double,_double> *)&local_1a0);
  local_170._0_8_ = 0x4010000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_288,local_3d8.m_storage.m_rows,1,
                   (scalar_constant_op<double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_1a0,(Lhs *)local_288,(Rhs *)&local_3d8,
                  (scalar_product_op<double,_double> *)&local_2b8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_380,(Lhs *)&local_c0,&local_1a0,
                  (scalar_difference_op<double,_double> *)local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_1d0,this_01,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_380);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_2f8,(Lhs *)&local_3f8,(Rhs *)&local_3c8,
                  (scalar_sum_op<double,_double> *)&local_2b8);
  local_200._0_8_ = 0x4000000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_2b8,
                   ((local_2f8.m_rhs)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
                   1,(scalar_constant_op<double> *)&local_200);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_170,(Lhs *)&local_2b8,&local_2f8,
                  (scalar_product_op<double,_double> *)&local_388);
  local_388.m_other = 4.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_200,local_3e8.m_storage.m_rows,1,&local_388);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_2b8,(Lhs *)&local_200,(Rhs *)&local_3e8,&local_3f9);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_288,(Lhs *)&local_170,&local_2b8,
                  (scalar_difference_op<double,_double> *)&local_200);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_1d0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&local_1d0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_1a0,(Lhs *)&local_3f8,(Rhs *)&local_3a8,
                  (scalar_sum_op<double,_double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_c0,(Lhs *)&local_1a0,(Rhs *)&local_3d8,
                  (scalar_difference_op<double,_double> *)&local_170);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_288,(Lhs *)&local_c0,(Rhs *)&local_3e8,
                  (scalar_difference_op<double,_double> *)&local_170);
  local_2b8._0_8_ = 0x4010000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_170,
                   (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_288._56_8_)->
                   m_storage).m_rows,1,(scalar_constant_op<double> *)&local_2b8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_380,(Lhs *)&local_170,(Rhs *)local_288,
                  (scalar_product_op<double,_double> *)&local_1d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,local_398,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_380);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_e0);
  local_c0._0_8_ = 0x4000000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
                    *)local_288,
                   (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                   m_storage.m_rows,2,(scalar_constant_op<double> *)&local_c0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
                   *)local_380,(Lhs *)local_288,this_01,
                  (scalar_product_op<double,_double> *)&local_170);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,2,0,_1,2>const>const,Eigen::Matrix<double,_1,2,0,_1,2>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_100,&this->gamma_x_2_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>
              *)local_380);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_100);
  free(local_3e8.m_storage.m_data);
  free(local_3a8.m_storage.m_data);
  free(local_3d8.m_storage.m_data);
  free(local_3c8.m_storage.m_data);
  free(local_3b8.m_storage.m_data);
  free(local_3f8.m_storage.m_data);
  return;
}

Assistant:

TriaO2::TriaO2(Eigen::Matrix<double, Eigen::Dynamic, 6> coords)
    : coords_(std::move(coords)),
      alpha_(coords_.rows()),
      beta_(coords_.rows(), 2),
      gamma_(coords_.rows(), 2),
      delta_(coords_.rows()),
      gamma_x_2_(coords_.rows(), 2) {
  /*
   *  2                                C
   *  | \                              | \
   *  5   4              ->            F   E
   *  |     \                          |     \
   *  0 - 3 - 1                        A - D - B
   */
  const Eigen::VectorXd& A = coords_.col(0);
  const Eigen::VectorXd& B = coords_.col(1);
  const Eigen::VectorXd& C = coords_.col(2);
  const Eigen::VectorXd& D = coords_.col(3);
  const Eigen::VectorXd& E = coords_.col(4);
  const Eigen::VectorXd& F = coords_.col(5);

  // Compute monomial coeffcients of componentwise quadratic
  // polynomial
  alpha_ << A;
  beta_ << 4. * D - 3. * A - B, 4. * F - 3. * A - C;
  gamma_ << 2. * (A + B) - 4. * D, 2. * (A + C) - 4. * F;
  delta_ << 4. * (A + E - D - F);
  // coefficient for Jacobian()
  gamma_x_2_ << 2. * gamma_;
}